

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fout.cpp
# Opt level: O3

void __thiscall spatial_region::compute_rho(spatial_region *this)

{
  cellj *pcVar1;
  uint uVar2;
  uint uVar3;
  cellj ***pppcVar4;
  pointer pfVar5;
  cellj *pcVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  undefined8 *puVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  particle *p;
  ulong uVar17;
  long lVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar27 [64];
  
  iVar11 = this->nx;
  uVar10 = (ulong)iVar11;
  if (0 < (long)uVar10) {
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar20 = vpbroadcastq_avx512f(ZEXT816(0x28));
    auVar21 = vpbroadcastq_avx512f(ZEXT816(8));
    uVar2 = this->ny;
    uVar3 = this->nz;
    uVar12 = 0;
    do {
      if (0 < (int)uVar2) {
        iVar9 = this->n_ion_populations;
        pppcVar4 = (this->cj).p._M_t.
                   super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                   super__Head_base<0UL,_cellj_***,_false>._M_head_impl;
        auVar22 = vpbroadcastq_avx512f();
        auVar22 = vpsllq_avx512f(auVar22,3);
        auVar23 = vpbroadcastq_avx512f();
        puVar13 = (undefined8 *)0x0;
        do {
          if (0 < (int)uVar3) {
            pfVar5 = (this->irho).
                     super__Vector_base<field3d<double>,_std::allocator<field3d<double>_>_>._M_impl.
                     super__Vector_impl_data._M_start;
            auVar24 = vpbroadcastq_avx512f();
            uVar17 = 0;
            auVar24 = vpsllq_avx512f(auVar24,3);
            pcVar6 = pppcVar4[uVar12][(long)puVar13];
            do {
              pcVar1 = pcVar6 + uVar17;
              pcVar1->jx = 0.0;
              pcVar1->jy = 0.0;
              pcVar6[uVar17].jz = 0.0;
              if (0 < iVar9) {
                auVar25 = vpbroadcastq_avx512f();
                auVar26 = vmovdqa64_avx512f(auVar19);
                auVar25 = vpsllq_avx512f(auVar25,3);
                uVar14 = (ulong)(iVar9 + 7U & 0xfffffff8);
                do {
                  vpmullq_avx512dq(auVar26,auVar20);
                  uVar8 = vpcmpuq_avx512f(auVar26,auVar23,2);
                  auVar26 = vpaddq_avx512f(auVar26,auVar21);
                  uVar14 = uVar14 - 8;
                  auVar27 = vpgatherqq_avx512f(*(undefined8 *)
                                                ((long)&(pfVar5->p)._M_t.
                                                                                                                
                                                  super___uniq_ptr_impl<double_**,_std::default_delete<double_**[]>_>
                                                  ._M_t + (long)puVar13));
                  bVar7 = (byte)uVar8;
                  auVar28._8_8_ = (ulong)((byte)(uVar8 >> 1) & 1) * auVar27._8_8_;
                  auVar28._0_8_ = (ulong)(bVar7 & 1) * auVar27._0_8_;
                  auVar28._16_8_ = (ulong)((byte)(uVar8 >> 2) & 1) * auVar27._16_8_;
                  auVar28._24_8_ = (ulong)((byte)(uVar8 >> 3) & 1) * auVar27._24_8_;
                  auVar28._32_8_ = (ulong)((byte)(uVar8 >> 4) & 1) * auVar27._32_8_;
                  auVar28._40_8_ = (ulong)((byte)(uVar8 >> 5) & 1) * auVar27._40_8_;
                  auVar28._48_8_ = (ulong)((byte)(uVar8 >> 6) & 1) * auVar27._48_8_;
                  auVar28._56_8_ = (uVar8 >> 7) * auVar27._56_8_;
                  vpaddq_avx512f(auVar28,auVar22);
                  auVar27 = vpgatherqq_avx512f(*puVar13);
                  auVar29._8_8_ = (ulong)((byte)(uVar8 >> 1) & 1) * auVar27._8_8_;
                  auVar29._0_8_ = (ulong)(bVar7 & 1) * auVar27._0_8_;
                  auVar29._16_8_ = (ulong)((byte)(uVar8 >> 2) & 1) * auVar27._16_8_;
                  auVar29._24_8_ = (ulong)((byte)(uVar8 >> 3) & 1) * auVar27._24_8_;
                  auVar29._32_8_ = (ulong)((byte)(uVar8 >> 4) & 1) * auVar27._32_8_;
                  auVar29._40_8_ = (ulong)((byte)(uVar8 >> 5) & 1) * auVar27._40_8_;
                  auVar29._48_8_ = (ulong)((byte)(uVar8 >> 6) & 1) * auVar27._48_8_;
                  auVar29._56_8_ = (uVar8 >> 7) * auVar27._56_8_;
                  vpaddq_avx512f(auVar29,auVar24);
                  auVar27 = vpgatherqq_avx512f(*puVar13);
                  auVar30._8_8_ = (ulong)((byte)(uVar8 >> 1) & 1) * auVar27._8_8_;
                  auVar30._0_8_ = (ulong)(bVar7 & 1) * auVar27._0_8_;
                  auVar30._16_8_ = (ulong)((byte)(uVar8 >> 2) & 1) * auVar27._16_8_;
                  auVar30._24_8_ = (ulong)((byte)(uVar8 >> 3) & 1) * auVar27._24_8_;
                  auVar30._32_8_ = (ulong)((byte)(uVar8 >> 4) & 1) * auVar27._32_8_;
                  auVar30._40_8_ = (ulong)((byte)(uVar8 >> 5) & 1) * auVar27._40_8_;
                  auVar30._48_8_ = (ulong)((byte)(uVar8 >> 6) & 1) * auVar27._48_8_;
                  auVar30._56_8_ = (uVar8 >> 7) * auVar27._56_8_;
                  auVar27 = vpaddq_avx512f(auVar30,auVar25);
                  vscatterqpd_avx512f(ZEXT864(0) + auVar27,uVar8,ZEXT864(0) << 0x40);
                } while (uVar14 != 0);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 != uVar3);
          }
          puVar13 = (undefined8 *)((long)puVar13 + 1);
        } while (puVar13 != (undefined8 *)(ulong)uVar2);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar10);
    if (0 < iVar11) {
      iVar11 = this->ny;
      lVar18 = 0;
      do {
        if (0 < iVar11) {
          iVar9 = this->nz;
          lVar15 = 0;
          do {
            if (0 < iVar9) {
              lVar16 = 0;
              do {
                p = (this->cp).p._M_t.
                    super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                    super__Head_base<0UL,_cellp_***,_false>._M_head_impl[lVar18][lVar15][lVar16].pl.
                    start;
                if (p != (particle *)0x0) {
                  do {
                    rhodeposition(this,p);
                    p = p->next;
                  } while (p != (particle *)0x0);
                  iVar9 = this->nz;
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 < iVar9);
              iVar11 = this->ny;
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 < iVar11);
          uVar10 = (ulong)(uint)this->nx;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < (int)uVar10);
    }
  }
  return;
}

Assistant:

void spatial_region::compute_rho()
{
    particle* current;
    for(int i=0;i<nx;i++)
    {
        for(int j=0;j<ny;j++)
        {
            for(int k=0;k<nz;k++)
            {
                cj[i][j][k].jx = 0;
                cj[i][j][k].jy = 0;
                cj[i][j][k].jz = 0;
                for (int n=0;n<n_ion_populations;n++)
                    irho[n][i][j][k] = 0;
            }
        }
    }
    for(int i=0;i<nx;i++)
    {
        for(int j=0;j<ny;j++)
        {
            for(int k=0;k<nz;k++)
            {
                current = cp[i][j][k].pl.start;
                while(current!=0)
                {
                    rhodeposition(*current);
                    current = current->next;
                }
            }
        }
    }
}